

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZSS.cpp
# Opt level: O0

void DatUnpacker::LZSS::decompress(uchar *input,uint inputSize,uchar *output,uint outputSize)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  int local_1074;
  uchar byte_2;
  int j;
  uchar byte_1;
  uint i;
  uchar *end_1;
  uchar byte;
  uchar *end;
  uchar *outputEnd;
  uchar *inputEnd;
  byte local_1038 [6];
  uchar L;
  uchar F;
  uchar dictionary [4096];
  ushort local_2a;
  ushort local_28;
  short N;
  unsigned_short DI;
  unsigned_short DO;
  unsigned_short D;
  uint outputSize_local;
  uchar *output_local;
  byte *pbStack_10;
  uint inputSize_local;
  uchar *input_local;
  
  _DO = output;
  pbStack_10 = input;
  while( true ) {
    if (input + inputSize <= pbStack_10) {
      return;
    }
    pbVar4 = pbStack_10 + 1;
    bVar1 = *pbStack_10;
    pbStack_10 = pbStack_10 + 2;
    sVar3 = CONCAT11(bVar1,*pbVar4);
    if (sVar3 == 0) break;
    if ((char)bVar1 < '\0') {
      pbVar4 = pbStack_10 + -(long)(int)sVar3;
      while (pbStack_10 < pbVar4 && _DO < output + outputSize) {
        *_DO = *pbStack_10;
        _DO = _DO + 1;
        pbStack_10 = pbStack_10 + 1;
      }
    }
    else {
      local_28 = 0xfee;
      memset(local_1038,0x20,0x1000);
      pbVar4 = pbStack_10 + (int)sVar3;
      while (pbStack_10 < pbVar4) {
        inputEnd._7_1_ = *pbStack_10;
        pbStack_10 = pbStack_10 + 1;
        for (j = 0; j != 8 && pbStack_10 < pbVar4; j = j + 1) {
          if ((inputEnd._7_1_ & 1) == 0) {
            pbVar5 = pbStack_10 + 2;
            bVar1 = pbStack_10[1];
            local_2a = (ushort)*pbStack_10 | (bVar1 & 0xf0) << 4;
            for (local_1074 = 0; pbStack_10 = pbVar5, local_1074 < (int)((bVar1 & 0xf) + 3);
                local_1074 = local_1074 + 1) {
              bVar2 = local_1038[local_2a];
              *_DO = bVar2;
              local_1038[local_28] = bVar2;
              local_2a = local_2a + 1;
              local_28 = local_28 + 1;
              if (0xfff < local_28) {
                local_28 = 0;
              }
              if (0xfff < local_2a) {
                local_2a = 0;
              }
              _DO = _DO + 1;
            }
          }
          else {
            pbVar5 = pbStack_10 + 1;
            bVar1 = *pbStack_10;
            pbVar6 = _DO + 1;
            *_DO = bVar1;
            local_1038[local_28] = bVar1;
            local_28 = local_28 + 1;
            _DO = pbVar6;
            pbStack_10 = pbVar5;
            if (0xfff < local_28) {
              local_28 = 0;
            }
          }
          inputEnd._7_1_ = (byte)((int)(uint)inputEnd._7_1_ >> 1);
        }
      }
    }
  }
  return;
}

Assistant:

void  LZSS::decompress(unsigned char* input, unsigned int inputSize, unsigned char* output, unsigned int outputSize)
    {
        const unsigned short D = 4096;
        unsigned short DO, DI = 0;
        short N;
        unsigned char dictionary[D];
        unsigned char F = 0;
        unsigned char L = 0;
        unsigned char* inputEnd = input + inputSize;
        unsigned char* outputEnd = output + outputSize;

        while (input < inputEnd)
        {

            N = *(input++) << 8;
            N |= *(input++);
            if (N == 0) return;

            if (N < 0)
            {
                unsigned char* end = input - N;
                while (input < end && output < outputEnd)
                {
                    unsigned char byte = *(input++);
                    *(output++) = byte;
                }
            }
            else
            {
                DO = D-18;
                memset(dictionary, ' ', D);
                unsigned char* end = input + N;
                while (input < end)
                {
                    F = *(input++);
                    for (unsigned int i = 0; i != 8 && input < end; ++i)
                    {
                        if ((F & 1) != 0)
                        {
                            unsigned char byte = *(input++);
                            *(output++) = byte;
                            dictionary[DO] = byte;
                            DO++;
                            if (DO >= D) DO = 0;
                        }
                        else
                        {
                            DI = *(input++);
                            L = *(input++);
                            DI = DI | ((0xF0 & L) << 4);
                            L &= 0x0F;

                            for (int j = 0; j < L+3; j++)
                            {
                                unsigned char byte = dictionary[DI];
                                *(output++) = byte;
                                dictionary[DO] = byte;
                                DI++;
                                DO++;
                                if (DO >= D) DO = 0;
                                if (DI >= D) DI = 0;
                            }
                        }
                        F >>= 1;
                    }
                }
            }
        }
    }